

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

void __thiscall
QRegularExpressionPrivate::~QRegularExpressionPrivate(QRegularExpressionPrivate *this)

{
  Data *pDVar1;
  
  pcre2_code_free_16(this->compiledPattern);
  this->compiledPattern = (pcre2_code_16 *)0x0;
  this->errorCode = 0;
  this->errorOffset = -1;
  this->capturingCount = 0;
  this->usingCrLfNewlines = false;
  pDVar1 = (this->pattern).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->pattern).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QRegularExpressionPrivate::~QRegularExpressionPrivate()
{
    cleanCompiledPattern();
}